

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O2

int fits_shuffle_4bytes(char *heap,LONGLONG length,int *status)

{
  int extraout_EAX;
  int extraout_EAX_00;
  void *__src;
  long lVar1;
  long lVar2;
  
  __src = malloc(length * 4);
  if (__src != (void *)0x0) {
    lVar1 = 0;
    lVar2 = 0;
    if (0 < length) {
      lVar2 = length;
    }
    for (; lVar2 != lVar1; lVar1 = lVar1 + 1) {
      *(char *)((long)__src + lVar1) = heap[lVar1 * 4];
      *(char *)((long)__src + lVar1 + length) = heap[lVar1 * 4 + 1];
      *(char *)((long)__src + lVar1 + length * 2) = heap[lVar1 * 4 + 2];
      *(char *)((long)__src + lVar1 + length * 3) = heap[lVar1 * 4 + 3];
    }
    memcpy(heap,__src,length * 4);
    free(__src);
    return extraout_EAX;
  }
  ffpmsg("malloc failed\n");
  return extraout_EAX_00;
}

Assistant:

static int fits_shuffle_4bytes(char *heap, LONGLONG length, int *status)

/* shuffle the bytes in an array of 4-byte integers or floats  */

{
    LONGLONG ii;
    char *ptr, *cptr, *heapptr;
    
    ptr = malloc((size_t) (length * 4));
    if (!ptr) {
      ffpmsg("malloc failed\n");
      return(*status);
    }

    heapptr = heap;
    cptr = ptr;
 
    for (ii = 0; ii < length; ii++) {
       *cptr = *heapptr;
       heapptr++;
       *(cptr + length) = *heapptr;
       heapptr++;
       *(cptr + (length * 2)) = *heapptr;
       heapptr++;
       *(cptr + (length * 3)) = *heapptr;
       heapptr++;
       cptr++;
    }
        
    memcpy(heap, ptr, (size_t) (length * 4));
    free(ptr);

    return(*status);
}